

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

SampledSpectrum * phyr::SampledSpectrum::getFromRGB(double *rgb,SpectrumType type)

{
  int in_EDX;
  double *in_RSI;
  SampledSpectrum *in_RDI;
  SampledSpectrum r;
  CoefficientSpectrum<60> *in_stack_ffffffffffffc3d8;
  SampledSpectrum *this;
  double in_stack_ffffffffffffc3f0;
  double in_stack_ffffffffffffc3f8;
  CoefficientSpectrum<60> *in_stack_ffffffffffffc400;
  CoefficientSpectrum<60> local_3a30;
  CoefficientSpectrum<60> local_3850;
  CoefficientSpectrum<60> local_3670;
  CoefficientSpectrum<60> local_3490;
  CoefficientSpectrum<60> local_32b0;
  CoefficientSpectrum<60> local_30d0;
  CoefficientSpectrum<60> local_2ef0;
  CoefficientSpectrum<60> local_2d10;
  CoefficientSpectrum<60> local_2b30;
  CoefficientSpectrum<60> local_2950;
  CoefficientSpectrum<60> local_2770;
  CoefficientSpectrum<60> local_2590;
  CoefficientSpectrum<60> local_23b0;
  CoefficientSpectrum<60> local_21d0;
  CoefficientSpectrum<60> local_1ff0;
  CoefficientSpectrum<60> local_1e10;
  CoefficientSpectrum<60> local_1c30;
  CoefficientSpectrum<60> local_1a50;
  CoefficientSpectrum<60> local_1870;
  CoefficientSpectrum<60> local_1690;
  CoefficientSpectrum<60> local_14b0;
  CoefficientSpectrum<60> local_12d0;
  CoefficientSpectrum<60> local_10f0;
  CoefficientSpectrum<60> local_f10;
  CoefficientSpectrum<60> local_d30;
  CoefficientSpectrum<60> local_b50;
  CoefficientSpectrum<60> local_970;
  CoefficientSpectrum<60> local_790;
  CoefficientSpectrum<60> local_5b0;
  CoefficientSpectrum<60> local_3d0;
  CoefficientSpectrum<60> local_1f0;
  int local_c;
  double *local_8;
  
  this = in_RDI;
  local_c = in_EDX;
  local_8 = in_RSI;
  SampledSpectrum(in_RDI,(double)in_stack_ffffffffffffc3d8);
  if (local_c == 0) {
    if ((local_8[1] < *local_8) || (local_8[2] < *local_8)) {
      if ((*local_8 < local_8[1]) || (local_8[2] < local_8[1])) {
        operator*((double)this,in_stack_ffffffffffffc3d8);
        CoefficientSpectrum<60>::operator+=(&local_1f0,&local_1690);
        if (local_8[1] < *local_8) {
          operator*((double)this,in_stack_ffffffffffffc3d8);
          CoefficientSpectrum<60>::operator+=(&local_1f0,&local_1c30);
          operator*((double)this,in_stack_ffffffffffffc3d8);
          CoefficientSpectrum<60>::operator+=(&local_1f0,&local_1e10);
        }
        else {
          operator*((double)this,in_stack_ffffffffffffc3d8);
          CoefficientSpectrum<60>::operator+=(&local_1f0,&local_1870);
          operator*((double)this,in_stack_ffffffffffffc3d8);
          CoefficientSpectrum<60>::operator+=(&local_1f0,&local_1a50);
        }
      }
      else {
        operator*((double)this,in_stack_ffffffffffffc3d8);
        CoefficientSpectrum<60>::operator+=(&local_1f0,&local_d30);
        if (local_8[2] < *local_8) {
          operator*((double)this,in_stack_ffffffffffffc3d8);
          CoefficientSpectrum<60>::operator+=(&local_1f0,&local_12d0);
          operator*((double)this,in_stack_ffffffffffffc3d8);
          CoefficientSpectrum<60>::operator+=(&local_1f0,&local_14b0);
        }
        else {
          operator*((double)this,in_stack_ffffffffffffc3d8);
          CoefficientSpectrum<60>::operator+=(&local_1f0,&local_f10);
          operator*((double)this,in_stack_ffffffffffffc3d8);
          CoefficientSpectrum<60>::operator+=(&local_1f0,&local_10f0);
        }
      }
    }
    else {
      operator*((double)this,in_stack_ffffffffffffc3d8);
      CoefficientSpectrum<60>::operator+=(&local_1f0,&local_3d0);
      if (local_8[2] < local_8[1]) {
        operator*((double)this,in_stack_ffffffffffffc3d8);
        CoefficientSpectrum<60>::operator+=(&local_1f0,&local_970);
        operator*((double)this,in_stack_ffffffffffffc3d8);
        CoefficientSpectrum<60>::operator+=(&local_1f0,&local_b50);
      }
      else {
        operator*((double)this,in_stack_ffffffffffffc3d8);
        CoefficientSpectrum<60>::operator+=(&local_1f0,&local_5b0);
        operator*((double)this,in_stack_ffffffffffffc3d8);
        CoefficientSpectrum<60>::operator+=(&local_1f0,&local_790);
      }
    }
    CoefficientSpectrum<60>::operator*=(&local_1f0,0.94);
  }
  else {
    if ((local_8[1] < *local_8) || (local_8[2] < *local_8)) {
      if ((*local_8 < local_8[1]) || (local_8[2] < local_8[1])) {
        operator*((double)this,in_stack_ffffffffffffc3d8);
        CoefficientSpectrum<60>::operator+=(&local_1f0,&local_32b0);
        if (local_8[1] < *local_8) {
          operator*((double)this,in_stack_ffffffffffffc3d8);
          CoefficientSpectrum<60>::operator+=(&local_1f0,&local_3850);
          operator*((double)this,in_stack_ffffffffffffc3d8);
          CoefficientSpectrum<60>::operator+=(&local_1f0,&local_3a30);
        }
        else {
          operator*((double)this,in_stack_ffffffffffffc3d8);
          CoefficientSpectrum<60>::operator+=(&local_1f0,&local_3490);
          operator*((double)this,in_stack_ffffffffffffc3d8);
          CoefficientSpectrum<60>::operator+=(&local_1f0,&local_3670);
        }
      }
      else {
        operator*((double)this,in_stack_ffffffffffffc3d8);
        CoefficientSpectrum<60>::operator+=(&local_1f0,&local_2950);
        if (local_8[2] < *local_8) {
          operator*((double)this,in_stack_ffffffffffffc3d8);
          CoefficientSpectrum<60>::operator+=(&local_1f0,&local_2ef0);
          operator*((double)this,in_stack_ffffffffffffc3d8);
          CoefficientSpectrum<60>::operator+=(&local_1f0,&local_30d0);
        }
        else {
          operator*((double)this,in_stack_ffffffffffffc3d8);
          CoefficientSpectrum<60>::operator+=(&local_1f0,&local_2b30);
          operator*((double)this,in_stack_ffffffffffffc3d8);
          CoefficientSpectrum<60>::operator+=(&local_1f0,&local_2d10);
        }
      }
    }
    else {
      operator*((double)this,in_stack_ffffffffffffc3d8);
      CoefficientSpectrum<60>::operator+=(&local_1f0,&local_1ff0);
      if (local_8[2] < local_8[1]) {
        operator*((double)this,in_stack_ffffffffffffc3d8);
        CoefficientSpectrum<60>::operator+=(&local_1f0,&local_2590);
        operator*((double)this,in_stack_ffffffffffffc3d8);
        CoefficientSpectrum<60>::operator+=(&local_1f0,&local_2770);
      }
      else {
        operator*((double)this,in_stack_ffffffffffffc3d8);
        CoefficientSpectrum<60>::operator+=(&local_1f0,&local_21d0);
        operator*((double)this,in_stack_ffffffffffffc3d8);
        CoefficientSpectrum<60>::operator+=(&local_1f0,&local_23b0);
      }
    }
    CoefficientSpectrum<60>::operator*=(&local_1f0,0.8644499778747559);
  }
  CoefficientSpectrum<60>::clamp
            (in_stack_ffffffffffffc400,in_stack_ffffffffffffc3f8,in_stack_ffffffffffffc3f0);
  SampledSpectrum(this,in_stack_ffffffffffffc3d8);
  return in_RDI;
}

Assistant:

SampledSpectrum SampledSpectrum::getFromRGB(const Real rgb[3], SpectrumType type) {
    SampledSpectrum r;
    if (type == SpectrumType::Reflectance) {
        // Convert reflectance spectrum to RGB
        if (rgb[0] <= rgb[1] && rgb[0] <= rgb[2]) {
            // Compute reflectance _SampledSpectrum_ with _rgb[0]_ as minimum
            r += rgb[0] * rgbRefl2SpectWhite;
            if (rgb[1] <= rgb[2]) {
                r += (rgb[1] - rgb[0]) * rgbRefl2SpectCyan;
                r += (rgb[2] - rgb[1]) * rgbRefl2SpectBlue;
            } else {
                r += (rgb[2] - rgb[0]) * rgbRefl2SpectCyan;
                r += (rgb[1] - rgb[2]) * rgbRefl2SpectGreen;
            }
        } else if (rgb[1] <= rgb[0] && rgb[1] <= rgb[2]) {
            // Compute reflectance _SampledSpectrum_ with _rgb[1]_ as minimum
            r += rgb[1] * rgbRefl2SpectWhite;
            if (rgb[0] <= rgb[2]) {
                r += (rgb[0] - rgb[1]) * rgbRefl2SpectMagenta;
                r += (rgb[2] - rgb[0]) * rgbRefl2SpectBlue;
            } else {
                r += (rgb[2] - rgb[1]) * rgbRefl2SpectMagenta;
                r += (rgb[0] - rgb[2]) * rgbRefl2SpectRed;
            }
        } else {
            // Compute reflectance _SampledSpectrum_ with _rgb[2]_ as minimum
            r += rgb[2] * rgbRefl2SpectWhite;
            if (rgb[0] <= rgb[1]) {
                r += (rgb[0] - rgb[2]) * rgbRefl2SpectYellow;
                r += (rgb[1] - rgb[0]) * rgbRefl2SpectGreen;
            } else {
                r += (rgb[1] - rgb[2]) * rgbRefl2SpectYellow;
                r += (rgb[0] - rgb[1]) * rgbRefl2SpectRed;
            }
        }
        r *= .94;
    } else {
        // Convert illuminant spectrum to RGB
        if (rgb[0] <= rgb[1] && rgb[0] <= rgb[2]) {
            // Compute illuminant _SampledSpectrum_ with _rgb[0]_ as minimum
            r += rgb[0] * rgbIllum2SpectWhite;
            if (rgb[1] <= rgb[2]) {
                r += (rgb[1] - rgb[0]) * rgbIllum2SpectCyan;
                r += (rgb[2] - rgb[1]) * rgbIllum2SpectBlue;
            } else {
                r += (rgb[2] - rgb[0]) * rgbIllum2SpectCyan;
                r += (rgb[1] - rgb[2]) * rgbIllum2SpectGreen;
            }
        } else if (rgb[1] <= rgb[0] && rgb[1] <= rgb[2]) {
            // Compute illuminant _SampledSpectrum_ with _rgb[1]_ as minimum
            r += rgb[1] * rgbIllum2SpectWhite;
            if (rgb[0] <= rgb[2]) {
                r += (rgb[0] - rgb[1]) * rgbIllum2SpectMagenta;
                r += (rgb[2] - rgb[0]) * rgbIllum2SpectBlue;
            } else {
                r += (rgb[2] - rgb[1]) * rgbIllum2SpectMagenta;
                r += (rgb[0] - rgb[2]) * rgbIllum2SpectRed;
            }
        } else {
            // Compute illuminant _SampledSpectrum_ with _rgb[2]_ as minimum
            r += rgb[2] * rgbIllum2SpectWhite;
            if (rgb[0] <= rgb[1]) {
                r += (rgb[0] - rgb[2]) * rgbIllum2SpectYellow;
                r += (rgb[1] - rgb[0]) * rgbIllum2SpectGreen;
            } else {
                r += (rgb[1] - rgb[2]) * rgbIllum2SpectYellow;
                r += (rgb[0] - rgb[1]) * rgbIllum2SpectRed;
            }
        }
        r *= .86445f;
    }

    return r.clamp();
}